

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pai.c
# Opt level: O2

size_t duckdb_je_pai_alloc_batch_default
                 (tsdn_t *tsdn,pai_t *self,size_t size,size_t nallocs,edata_list_active_t *results,
                 _Bool frequent_reuse,_Bool *deferred_work_generated)

{
  edata_t *peVar1;
  edata_t *peVar2;
  size_t i;
  size_t sVar3;
  _Bool deferred_by_alloc;
  size_t local_38;
  
  sVar3 = 0;
  local_38 = size;
  while( true ) {
    if (nallocs == sVar3) {
      return nallocs;
    }
    deferred_by_alloc = false;
    peVar2 = (*self->alloc)(tsdn,self,local_38,0x1000,false,false,frequent_reuse,&deferred_by_alloc)
    ;
    *deferred_work_generated = (_Bool)(*deferred_work_generated | deferred_by_alloc);
    if (peVar2 == (edata_t *)0x0) break;
    (peVar2->field_5).ql_link_active.qre_next = peVar2;
    (peVar2->field_5).ql_link_active.qre_prev = peVar2;
    peVar1 = (results->head).qlh_first;
    if (peVar1 != (edata_t *)0x0) {
      (peVar2->field_5).ql_link_active.qre_next = (peVar1->field_5).ql_link_active.qre_prev;
      (((results->head).qlh_first)->field_5).ql_link_active.qre_prev = peVar2;
      (peVar2->field_5).ql_link_active.qre_prev =
           (((peVar2->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.qre_next;
      peVar1 = (results->head).qlh_first;
      (((peVar1->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.qre_next = peVar1;
      (((peVar2->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.qre_next = peVar2;
      peVar2 = (peVar2->field_5).ql_link_active.qre_next;
    }
    (results->head).qlh_first = peVar2;
    sVar3 = sVar3 + 1;
  }
  return sVar3;
}

Assistant:

size_t
pai_alloc_batch_default(tsdn_t *tsdn, pai_t *self, size_t size, size_t nallocs,
    edata_list_active_t *results, bool frequent_reuse,
    bool *deferred_work_generated) {
	for (size_t i = 0; i < nallocs; i++) {
		bool deferred_by_alloc = false;
		edata_t *edata = pai_alloc(tsdn, self, size, PAGE,
		    /* zero */ false, /* guarded */ false, frequent_reuse,
		    &deferred_by_alloc);
		*deferred_work_generated |= deferred_by_alloc;
		if (edata == NULL) {
			return i;
		}
		edata_list_active_append(results, edata);
	}
	return nallocs;
}